

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O2

void __thiscall icu_63::Locale::~Locale(Locale *this)

{
  char *buffer;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Locale_003a8cf0;
  buffer = this->fullName;
  if (this->baseName != buffer) {
    uprv_free_63(this->baseName);
    buffer = this->fullName;
  }
  this->baseName = (char *)0x0;
  if (buffer != this->fullNameBuffer) {
    uprv_free_63(buffer);
    this->fullName = (char *)0x0;
  }
  UObject::~UObject(&this->super_UObject);
  return;
}

Assistant:

Locale::~Locale()
{
    if (baseName != fullName) {
        uprv_free(baseName);
    }
    baseName = NULL;
    /*if fullName is on the heap, we free it*/
    if (fullName != fullNameBuffer)
    {
        uprv_free(fullName);
        fullName = NULL;
    }
}